

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestPageControl::testBusy(TestPageControl *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  QColor *pQVar7;
  PageControl p;
  QSignalSpy spy;
  
  QtMWidgets::PageControl::PageControl(&p,(QWidget *)0x0);
  QWidget::resize(&p.super_QWidget,this->m_btnSize * 3,this->m_btnSize << 2);
  QWidget::show();
  bVar3 = (bool)QTest::qWaitForWindowActive(&p.super_QWidget,5000);
  cVar4 = QTest::qVerify(bVar3,"QTest::qWaitForWindowActive( &p )","",
                         "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                         ,0x24);
  if (cVar4 != '\0') {
    iVar6 = *(int *)(p._32_8_ + 0x1c);
    iVar1 = *(int *)(p._32_8_ + 0x14);
    iVar2 = this->m_btnSize;
    QColor::QColor((QColor *)&spy,red);
    QtMWidgets::PageControl::setPageIndicatorColor(&p,(QColor *)&spy);
    QColor::QColor((QColor *)&spy,red);
    QtMWidgets::PageControl::setCurrentPageIndicatorColor(&p,(QColor *)&spy);
    pQVar7 = QtMWidgets::PageControl::pageIndicatorColor(&p);
    QColor::QColor((QColor *)&spy,red);
    bVar3 = (bool)QColor::operator==(pQVar7,(QColor *)&spy);
    cVar4 = QTest::qVerify(bVar3,"p.pageIndicatorColor() == Qt::red","",
                           "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                           ,0x2b);
    if (cVar4 != '\0') {
      pQVar7 = QtMWidgets::PageControl::currentPageIndicatorColor(&p);
      QColor::QColor((QColor *)&spy,red);
      bVar3 = (bool)QColor::operator==(pQVar7,(QColor *)&spy);
      cVar4 = QTest::qVerify(bVar3,"p.currentPageIndicatorColor() == Qt::red","",
                             "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                             ,0x2c);
      if (cVar4 != '\0') {
        QtMWidgets::PageControl::setCount(&p,10);
        QtMWidgets::PageControl::setCurrentIndex(&p,4);
        iVar5 = QtMWidgets::PageControl::count(&p);
        cVar4 = QTest::qVerify(iVar5 == 10,"p.count() == 10","",
                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                               ,0x32);
        if (cVar4 != '\0') {
          iVar5 = QtMWidgets::PageControl::currentIndex(&p);
          cVar4 = QTest::qVerify(iVar5 == 4,"p.currentIndex() == 4","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                                 ,0x33);
          if (cVar4 != '\0') {
            iVar5 = this->m_btnSize;
            iVar6 = ((*(int *)(p._32_8_ + 0x1c) -
                     ((((iVar6 - iVar1) + 1) / iVar2) * iVar5 + *(int *)(p._32_8_ + 0x14))) + 1) / 2
            ;
            QTest::mouseClick(&p.super_QWidget,LeftButton,(KeyboardModifiers)0x0,
                              (QPoint)(((long)(iVar5 + iVar6 + -1) + (long)iVar6) / 2 & 0xffffffffU
                                      | (long)(iVar5 + -1) / 2 << 0x20),0x14);
            QTest::qWait(0x32);
            iVar6 = QtMWidgets::PageControl::currentIndex(&p);
            cVar4 = QTest::qVerify(iVar6 == 0,"p.currentIndex() == 0","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                                   ,0x3b);
            if (cVar4 != '\0') {
              QWidget::resize(&p.super_QWidget,this->m_btnSize * 10,this->m_btnSize * 2);
              QTest::qWait(0x32);
              iVar6 = *(int *)(p._32_8_ + 0x14);
              iVar1 = *(int *)(p._32_8_ + 0x1c);
              iVar2 = this->m_btnSize;
              QSignalSpy::QSignalSpy<void(QtMWidgets::PageControl::*)(int,int)>(&spy,&p,0x1651ce);
              iVar5 = this->m_btnSize;
              iVar6 = ((*(int *)(p._32_8_ + 0x1c) -
                       ((((iVar1 - iVar6) + 1) / iVar2) * iVar5 + *(int *)(p._32_8_ + 0x14))) + 1) /
                      2 + iVar5 * 4;
              QTest::mouseClick(&p.super_QWidget,LeftButton,(KeyboardModifiers)0x0,
                                (QPoint)(((long)(iVar5 + iVar6 + -1) + (long)iVar6) / 2 &
                                         0xffffffffU | (long)(iVar5 + -1) / 2 << 0x20),0x14);
              QTest::qWait(0x32);
              iVar6 = QtMWidgets::PageControl::currentIndex(&p);
              cVar4 = QTest::qVerify(iVar6 == 4,"p.currentIndex() == 4","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                                     ,0x4b);
              if (cVar4 != '\0') {
                QTest::qVerify(spy.super_QList<QList<QVariant>_>.d.size == 1,"spy.count() == 1","",
                               "/workspace/llm4binary/github/license_c_cmakelists/igormironchik[P]qtmwidgets/tests/auto/pagecontrol/main.cpp"
                               ,0x4c);
              }
              QSignalSpy::~QSignalSpy(&spy);
            }
          }
        }
      }
    }
  }
  QtMWidgets::PageControl::~PageControl(&p);
  return;
}

Assistant:

void testBusy()
	{
		QtMWidgets::PageControl p;

		p.resize( m_btnSize * 3, m_btnSize * 4 );
		p.show();

		QVERIFY( QTest::qWaitForWindowActive( &p ) );

		int count = p.width() / m_btnSize;

		p.setPageIndicatorColor( Qt::red );
		p.setCurrentPageIndicatorColor( Qt::red );

		QVERIFY( p.pageIndicatorColor() == Qt::red );
		QVERIFY( p.currentPageIndicatorColor() == Qt::red );

		p.setCount( 10 );

		p.setCurrentIndex( 4 );

		QVERIFY( p.count() == 10 );
		QVERIFY( p.currentIndex() == 4 );

		QTest::mouseClick( &p, Qt::LeftButton, {},
			QRect( ( p.width() - m_btnSize * count ) / 2, 0, m_btnSize, m_btnSize ).center(),
			20 );

		QTest::qWait( 50 );

		QVERIFY( p.currentIndex() == 0 );

		p.resize( m_btnSize * 10, m_btnSize * 2 );

		QTest::qWait( 50 );

		count = p.width() / m_btnSize;

		QSignalSpy spy( &p, &QtMWidgets::PageControl::currentChanged );

		QTest::mouseClick( &p, Qt::LeftButton, {},
			QRect( ( p.width() - m_btnSize * count ) / 2 + m_btnSize * 4, 0,
				m_btnSize, m_btnSize ).center(), 20 );

		QTest::qWait( 50 );

		QVERIFY( p.currentIndex() == 4 );
		QVERIFY( spy.count() == 1 );
	}